

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCursesCacheEntryComposite.cxx
# Opt level: O0

void __thiscall
cmCursesCacheEntryComposite::~cmCursesCacheEntryComposite(cmCursesCacheEntryComposite *this)

{
  cmCursesCacheEntryComposite *this_local;
  
  if (this->Label != (cmCursesLabelWidget *)0x0) {
    (*(this->Label->super_cmCursesWidget)._vptr_cmCursesWidget[1])();
  }
  if (this->IsNewLabel != (cmCursesLabelWidget *)0x0) {
    (*(this->IsNewLabel->super_cmCursesWidget)._vptr_cmCursesWidget[1])();
  }
  if (this->Entry != (cmCursesWidget *)0x0) {
    (*this->Entry->_vptr_cmCursesWidget[1])();
  }
  std::__cxx11::string::~string((string *)&this->Key);
  return;
}

Assistant:

cmCursesCacheEntryComposite::~cmCursesCacheEntryComposite()
{
  delete this->Label;
  delete this->IsNewLabel;
  delete this->Entry;
}